

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregateMarking.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::AggregateMarking::Decode(AggregateMarking *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  ushort local_50;
  KUINT16 i;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  AggregateMarking *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0x20) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  KDataStream::operator>>(local_18,&this->m_ui8AggregateMarkingCharacterSet);
  for (local_50 = 0; local_50 < 0x1f; local_50 = local_50 + 1) {
    KDataStream::operator>>(local_18,this->m_sAggregateMarkingString + local_50);
  }
  this->m_sAggregateMarkingString[0x1f] = '\0';
  return;
}

Assistant:

void AggregateMarking::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < AGGREGATE_MARKING_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8AggregateMarkingCharacterSet;

    for( KUINT16 i = 0; i < 31; ++i )
    {
        stream >> m_sAggregateMarkingString[i];
    }
    m_sAggregateMarkingString[31] = 0;
}